

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cc
# Opt level: O3

int __thiscall flow::Program::link(Program *this,char *__from,char *__to)

{
  pointer ppVar1;
  pointer pbVar2;
  pointer ppNVar3;
  pointer pcVar4;
  Program *pPVar5;
  byte bVar6;
  NativeCallback *pNVar7;
  NativeCallback *extraout_RAX;
  NativeCallback *extraout_RAX_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *module;
  pointer ppVar8;
  int iVar9;
  pointer pbVar10;
  long lVar11;
  undefined1 local_a8 [32];
  vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *local_88;
  Program *local_80;
  Report *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->runtime_ = (Runtime *)__from;
  ppVar1 = (this->cp_).modules_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar9 = 0;
  local_80 = this;
  local_78 = (Report *)__to;
  for (ppVar8 = (this->cp_).modules_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar5 = local_80, ppVar8 != ppVar1;
      ppVar8 = ppVar8 + 1) {
    bVar6 = (**(code **)(*(long *)__from + 0x10))(__from,ppVar8,&ppVar8->second,0);
    iVar9 = iVar9 + (uint)(bVar6 ^ 1);
  }
  local_88 = &local_80->nativeHandlers_;
  std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::resize
            (local_88,(long)*(pointer *)
                             ((long)&(local_80->cp_).nativeHandlerSignatures_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                      (long)(local_80->cp_).nativeHandlerSignatures_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar10 = (pPVar5->cp_).nativeHandlerSignatures_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = *(pointer *)
            ((long)&(pPVar5->cp_).nativeHandlerSignatures_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (pbVar10 != pbVar2) {
    lVar11 = 0;
    do {
      pNVar7 = Runtime::find((Runtime *)__from,pbVar10);
      ppNVar3 = (local_88->
                super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      if (pNVar7 == (NativeCallback *)0x0) {
        *(undefined8 *)((long)ppNVar3 + lVar11) = 0;
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,"Unresolved symbol to native handler signature: {}","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar4 = (pbVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + pbVar10->_M_string_length);
        diagnostics::Report::linkError<std::__cxx11::string>(local_78,(string *)local_a8,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((NativeCallback *)local_a8._0_8_ != (NativeCallback *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        iVar9 = iVar9 + 1;
      }
      else {
        *(NativeCallback **)((long)ppNVar3 + lVar11) = pNVar7;
      }
      pbVar10 = pbVar10 + 1;
      lVar11 = lVar11 + 8;
    } while (pbVar10 != pbVar2);
  }
  pPVar5 = local_80;
  local_88 = &local_80->nativeFunctions_;
  std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::resize
            (local_88,(long)*(pointer *)
                             ((long)&(local_80->cp_).nativeFunctionSignatures_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                      (long)(local_80->cp_).nativeFunctionSignatures_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar10 = (pPVar5->cp_).nativeFunctionSignatures_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = *(pointer *)
            ((long)&(pPVar5->cp_).nativeFunctionSignatures_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  pNVar7 = extraout_RAX;
  if (pbVar10 != pbVar2) {
    lVar11 = 0;
    do {
      pNVar7 = Runtime::find((Runtime *)__from,pbVar10);
      ppNVar3 = (local_88->
                super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      if (pNVar7 == (NativeCallback *)0x0) {
        *(undefined8 *)((long)ppNVar3 + lVar11) = 0;
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,"Unresolved native function signature: {}","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar4 = (pbVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + pbVar10->_M_string_length);
        diagnostics::Report::linkError<std::__cxx11::string>(local_78,(string *)local_a8,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pNVar7 = (NativeCallback *)(local_a8 + 0x10);
        if ((NativeCallback *)local_a8._0_8_ != pNVar7) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          pNVar7 = extraout_RAX_00;
        }
        iVar9 = iVar9 + 1;
      }
      else {
        *(NativeCallback **)((long)ppNVar3 + lVar11) = pNVar7;
      }
      pbVar10 = pbVar10 + 1;
      lVar11 = lVar11 + 8;
    } while (pbVar10 != pbVar2);
  }
  return (int)CONCAT71((int7)((ulong)pNVar7 >> 8),iVar9 == 0);
}

Assistant:

bool Program::link(Runtime* runtime, diagnostics::Report* report) {
  runtime_ = runtime;
  int errors = 0;

  // load runtime modules
  for (const auto& module : cp_.getModules()) {
    if (!runtime->import(module.first, module.second, nullptr)) {
      errors++;
    }
  }

  // link nattive handlers
  nativeHandlers_.resize(cp_.getNativeHandlerSignatures().size());
  size_t i = 0;
  for (const auto& signature : cp_.getNativeHandlerSignatures()) {
    // map to nativeHandlers_[i]
    if (NativeCallback* cb = runtime->find(signature)) {
      nativeHandlers_[i] = cb;
    } else {
      nativeHandlers_[i] = nullptr;
      report->linkError("Unresolved symbol to native handler signature: {}", signature);
      // TODO unresolvedSymbols_.push_back(signature);
      errors++;
    }
    ++i;
  }

  // link nattive functions
  nativeFunctions_.resize(cp_.getNativeFunctionSignatures().size());
  i = 0;
  for (const auto& signature : cp_.getNativeFunctionSignatures()) {
    if (NativeCallback* cb = runtime->find(signature)) {
      nativeFunctions_[i] = cb;
    } else {
      nativeFunctions_[i] = nullptr;
      report->linkError("Unresolved native function signature: {}", signature);
      errors++;
    }
    ++i;
  }

  return errors == 0;
}